

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O2

void Aig_ManChoiceConstructiveOne(Aig_Man_t *pNew,Aig_Man_t *pPrev,Aig_Man_t *pThis)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *p1;
  int iVar7;
  Vec_Ptr_t *p;
  
  if (pNew->nObjs[2] != pPrev->nObjs[2]) {
    __assert_fail("Aig_ManCiNum(pNew) == Aig_ManCiNum(pPrev)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                  ,0x5ca,"void Aig_ManChoiceConstructiveOne(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)")
    ;
  }
  if (pNew->nObjs[2] != pThis->nObjs[2]) {
    __assert_fail("Aig_ManCiNum(pNew) == Aig_ManCiNum(pThis)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                  ,0x5cb,"void Aig_ManChoiceConstructiveOne(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)")
    ;
  }
  if (pNew->nObjs[3] != pPrev->nObjs[3]) {
    __assert_fail("Aig_ManCoNum(pNew) == Aig_ManCoNum(pPrev)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                  ,0x5cc,"void Aig_ManChoiceConstructiveOne(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)")
    ;
  }
  if (pNew->nObjs[3] == pThis->nObjs[3]) {
    for (iVar7 = 0; iVar7 < pNew->vObjs->nSize; iVar7 = iVar7 + 1) {
      pvVar4 = Vec_PtrEntry(pNew->vObjs,iVar7);
      if (pvVar4 != (void *)0x0) {
        *(byte *)((long)pvVar4 + 0x18) = *(byte *)((long)pvVar4 + 0x18) | 0x20;
      }
    }
    for (iVar7 = 0; iVar7 < pPrev->vObjs->nSize; iVar7 = iVar7 + 1) {
      pvVar4 = Vec_PtrEntry(pPrev->vObjs,iVar7);
      if ((pvVar4 != (void *)0x0) &&
         ((*(byte *)((*(ulong *)((long)pvVar4 + 0x28) & 0xfffffffffffffffe) + 0x18) & 0x20) == 0)) {
        __assert_fail("Aig_Regular((Aig_Obj_t *)pObj->pData)->fMarkB",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                      ,0x5d2,
                      "void Aig_ManChoiceConstructiveOne(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)");
      }
    }
    for (iVar7 = 0; iVar7 < pNew->vObjs->nSize; iVar7 = iVar7 + 1) {
      pvVar4 = Vec_PtrEntry(pNew->vObjs,iVar7);
      if (pvVar4 != (void *)0x0) {
        *(byte *)((long)pvVar4 + 0x18) = *(byte *)((long)pvVar4 + 0x18) & 0xdf;
      }
    }
    iVar7 = 0;
    while( true ) {
      p = pPrev->vObjs;
      iVar3 = p->nSize;
      if (iVar3 <= iVar7) break;
      pvVar4 = Vec_PtrEntry(p,iVar7);
      if (pvVar4 != (void *)0x0) {
        *(byte *)((long)pvVar4 + 0x18) = *(byte *)((long)pvVar4 + 0x18) | 0x20;
      }
      iVar7 = iVar7 + 1;
    }
    for (iVar7 = 0; iVar7 < iVar3; iVar7 = iVar7 + 1) {
      pvVar4 = Vec_PtrEntry(p,iVar7);
      if (pvVar4 != (void *)0x0) {
        *(byte *)((long)pvVar4 + 0x18) = *(byte *)((long)pvVar4 + 0x18) & 0xdf;
      }
      p = pPrev->vObjs;
      iVar3 = p->nSize;
    }
    pThis->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)pNew->pConst1;
    for (iVar7 = 0; iVar7 < pThis->vCis->nSize; iVar7 = iVar7 + 1) {
      pvVar4 = Vec_PtrEntry(pThis->vCis,iVar7);
      pAVar5 = Aig_ManCi(pNew,iVar7);
      *(Aig_Obj_t **)((long)pvVar4 + 0x28) = pAVar5;
    }
    for (iVar7 = 0; iVar7 < pThis->vCos->nSize; iVar7 = iVar7 + 1) {
      pvVar4 = Vec_PtrEntry(pThis->vCos,iVar7);
      pAVar5 = Aig_ManCo(pNew,iVar7);
      *(Aig_Obj_t **)((long)pvVar4 + 0x28) = pAVar5;
    }
    for (iVar7 = 0; iVar7 < pThis->vObjs->nSize; iVar7 = iVar7 + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pThis->vObjs,iVar7);
      if ((pAVar5 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar5->field_0x18 & 7) - 7)) {
        pAVar6 = Aig_ObjChild0Copy(pAVar5);
        p1 = Aig_ObjChild1Copy(pAVar5);
        pAVar6 = Aig_And(pNew,pAVar6,p1);
        (pAVar5->field_5).pData = pAVar6;
      }
    }
    iVar7 = 0;
    while( true ) {
      if (pThis->vCos->nSize <= iVar7) {
        return;
      }
      pvVar4 = Vec_PtrEntry(pThis->vCos,iVar7);
      pAVar5 = Aig_ManCo(pNew,iVar7);
      if (pNew->pReprs == (Aig_Obj_t **)0x0) {
        __assert_fail("p->pReprs != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                      ,0x5ac,"void Aig_ObjSetRepr_(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      pAVar5 = (Aig_Obj_t *)((ulong)pAVar5->pFanin0 & 0xfffffffffffffffe);
      iVar3 = pAVar5->Id;
      if (pNew->nReprsAlloc <= iVar3) {
        __assert_fail("pNode1->Id < p->nReprsAlloc",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                      ,0x5af,"void Aig_ObjSetRepr_(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      pAVar6 = (Aig_Obj_t *)
               (*(ulong *)((*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe) + 0x28) &
               0xfffffffffffffffe);
      iVar1 = pAVar6->Id;
      if (pNew->nReprsAlloc <= iVar1) break;
      if (pAVar5 != pAVar6) {
        iVar2 = iVar1;
        if (iVar1 < iVar3) {
          iVar2 = iVar3;
        }
        if (iVar3 < iVar1) {
          pAVar6 = pAVar5;
        }
        pNew->pReprs[iVar2] = pAVar6;
      }
      iVar7 = iVar7 + 1;
    }
    __assert_fail("pNode2->Id < p->nReprsAlloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                  ,0x5b0,"void Aig_ObjSetRepr_(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  __assert_fail("Aig_ManCoNum(pNew) == Aig_ManCoNum(pThis)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                ,0x5cd,"void Aig_ManChoiceConstructiveOne(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)");
}

Assistant:

void Aig_ManChoiceConstructiveOne( Aig_Man_t * pNew, Aig_Man_t * pPrev, Aig_Man_t * pThis )
{
    Aig_Obj_t * pObj, * pObjNew;
    int i;
    assert( Aig_ManCiNum(pNew) == Aig_ManCiNum(pPrev) );
    assert( Aig_ManCiNum(pNew) == Aig_ManCiNum(pThis) );
    assert( Aig_ManCoNum(pNew) == Aig_ManCoNum(pPrev) );
    assert( Aig_ManCoNum(pNew) == Aig_ManCoNum(pThis) );
    // make sure the nodes of pPrev point to pNew
    Aig_ManForEachObj( pNew, pObj, i )
        pObj->fMarkB = 1;
    Aig_ManForEachObj( pPrev, pObj, i )
        assert( Aig_Regular((Aig_Obj_t *)pObj->pData)->fMarkB );
    Aig_ManForEachObj( pNew, pObj, i )
        pObj->fMarkB = 0;
    // make sure the nodes of pThis point to pPrev
    Aig_ManForEachObj( pPrev, pObj, i )
        pObj->fMarkB = 1;
    Aig_ManForEachObj( pPrev, pObj, i )
        pObj->fMarkB = 0;
    // remap nodes of pThis on top of pNew using pPrev
    pObj = Aig_ManConst1(pThis);
    pObj->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( pThis, pObj, i )
        pObj->pData = Aig_ManCi(pNew, i);
    Aig_ManForEachCo( pThis, pObj, i )
        pObj->pData = Aig_ManCo(pNew, i);
    // go through the nodes in the topological order
    Aig_ManForEachNode( pThis, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // set the inputs of POs as equivalent
    Aig_ManForEachCo( pThis, pObj, i )
    {
        pObjNew = Aig_ObjFanin0( Aig_ManCo(pNew,i) );
        // pObjNew and Aig_ObjFanin0(pObj)->pData are equivalent
        Aig_ObjSetRepr_( pNew, pObjNew, Aig_Regular((Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData) );
    }
}